

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O2

FT_Error ps_unicodes_init(FT_Memory memory,PS_Unicodes table,FT_UInt num_glyphs,
                         PS_GetGlyphNameFunc get_glyph_name,PS_FreeGlyphNameFunc free_glyph_name,
                         FT_Pointer glyph_data)

{
  undefined8 uVar1;
  FT_Error FVar2;
  int iVar3;
  FT_UInt32 FVar4;
  char *__s2;
  long lVar5;
  void *P;
  long lVar6;
  FT_UInt FVar7;
  uint uVar8;
  ulong uVar9;
  FT_UInt aFStack_c8 [2];
  FT_UInt extra_glyphs [10];
  int aiStack_98 [2];
  FT_UInt extra_glyph_list_states [10];
  PS_UniMap *local_50;
  FT_Error local_34;
  
  extra_glyph_list_states[2] = 0;
  extra_glyph_list_states[3] = 0;
  extra_glyph_list_states[4] = 0;
  extra_glyph_list_states[5] = 0;
  extra_glyph_list_states[6] = 0;
  extra_glyph_list_states[7] = 0;
  aiStack_98[0] = 0;
  aiStack_98[1] = 0;
  extra_glyph_list_states[0] = 0;
  extra_glyph_list_states[1] = 0;
  table->num_maps = 0;
  table->maps = (PS_UniMap *)0x0;
  FVar7 = 0;
  local_50 = (PS_UniMap *)ft_mem_realloc(memory,8,0,(ulong)(num_glyphs + 10),(void *)0x0,&local_34);
  table->maps = local_50;
  if (local_34 == 0) {
    extra_glyph_list_states._32_8_ = table;
    for (; uVar1 = extra_glyph_list_states._32_8_, FVar7 != num_glyphs; FVar7 = FVar7 + 1) {
      __s2 = (*get_glyph_name)(glyph_data,FVar7);
      if (__s2 != (char *)0x0) {
        lVar5 = 0;
        do {
          lVar6 = lVar5;
          if (lVar6 == 0x28) goto LAB_002102b1;
          iVar3 = strcmp("Delta" + *(int *)((long)ft_extra_glyph_name_offsets + lVar6),__s2);
          lVar5 = lVar6 + 4;
        } while (iVar3 != 0);
        if (*(int *)((long)extra_glyph_list_states + lVar6 + -8) == 0) {
          *(undefined4 *)((long)extra_glyph_list_states + lVar6 + -8) = 1;
          *(FT_UInt *)((long)aFStack_c8 + lVar6) = FVar7;
        }
LAB_002102b1:
        FVar4 = ps_unicode_value(__s2);
        if ((FVar4 & 0x7fffffff) != 0) {
          lVar5 = 0;
          do {
            lVar6 = lVar5;
            if (lVar6 == 0x28) goto LAB_002102ee;
            lVar5 = lVar6 + 4;
          } while (*(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar6) != FVar4);
          *(undefined4 *)((long)extra_glyph_list_states + lVar6 + -8) = 2;
LAB_002102ee:
          local_50->unicode = FVar4;
          local_50->glyph_index = FVar7;
          local_50 = local_50 + 1;
        }
        if (free_glyph_name != (PS_FreeGlyphNameFunc)0x0) {
          (*free_glyph_name)(glyph_data,__s2);
        }
      }
    }
    for (lVar5 = 0; lVar5 != 0x28; lVar5 = lVar5 + 4) {
      if (*(int *)((long)extra_glyph_list_states + lVar5 + -8) == 1) {
        local_50->unicode = *(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar5);
        local_50->glyph_index = *(FT_UInt *)((long)aFStack_c8 + lVar5);
        local_50 = local_50 + 1;
      }
    }
    P = *(void **)(extra_glyph_list_states._32_8_ + 0x20);
    uVar9 = (ulong)((long)local_50 - (long)P) >> 3;
    uVar8 = (uint)uVar9;
    if (uVar8 == 0) {
      ft_mem_free(memory,P);
      *(undefined8 *)(uVar1 + 0x20) = 0;
      FVar2 = 0xa3;
      if (local_34 != 0) {
        FVar2 = local_34;
      }
    }
    else {
      if (uVar8 < num_glyphs >> 1) {
        P = ft_mem_realloc(memory,8,(ulong)num_glyphs,uVar9 & 0xffffffff,P,&local_34);
        *(void **)(uVar1 + 0x20) = P;
        local_34 = 0;
      }
      qsort(P,uVar9 & 0xffffffff,8,compare_uni_maps);
      FVar2 = local_34;
    }
    local_34 = FVar2;
    *(uint *)(uVar1 + 0x18) = uVar8;
  }
  return local_34;
}

Assistant:

static FT_Error
  ps_unicodes_init( FT_Memory             memory,
                    PS_Unicodes           table,
                    FT_UInt               num_glyphs,
                    PS_GetGlyphNameFunc   get_glyph_name,
                    PS_FreeGlyphNameFunc  free_glyph_name,
                    FT_Pointer            glyph_data )
  {
    FT_Error  error;

    FT_UInt  extra_glyph_list_states[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    FT_UInt  extra_glyphs[EXTRA_GLYPH_LIST_SIZE];


    /* we first allocate the table */
    table->num_maps = 0;
    table->maps     = NULL;

    if ( !FT_NEW_ARRAY( table->maps, num_glyphs + EXTRA_GLYPH_LIST_SIZE ) )
    {
      FT_UInt     n;
      FT_UInt     count;
      PS_UniMap*  map;
      FT_UInt32   uni_char;


      map = table->maps;

      for ( n = 0; n < num_glyphs; n++ )
      {
        const char*  gname = get_glyph_name( glyph_data, n );


        if ( gname )
        {
          ps_check_extra_glyph_name( gname, n,
                                     extra_glyphs, extra_glyph_list_states );
          uni_char = ps_unicode_value( gname );

          if ( BASE_GLYPH( uni_char ) != 0 )
          {
            ps_check_extra_glyph_unicode( uni_char,
                                          extra_glyph_list_states );
            map->unicode     = uni_char;
            map->glyph_index = n;
            map++;
          }

          if ( free_glyph_name )
            free_glyph_name( glyph_data, gname );
        }
      }

      for ( n = 0; n < EXTRA_GLYPH_LIST_SIZE; n++ )
      {
        if ( extra_glyph_list_states[n] == 1 )
        {
          /* This glyph name has an additional representation. */
          /* Add it to the cmap.                               */

          map->unicode     = ft_extra_glyph_unicodes[n];
          map->glyph_index = extra_glyphs[n];
          map++;
        }
      }

      /* now compress the table a bit */
      count = (FT_UInt)( map - table->maps );

      if ( count == 0 )
      {
        /* No unicode chars here! */
        FT_FREE( table->maps );
        if ( !error )
          error = FT_THROW( No_Unicode_Glyph_Name );
      }
      else
      {
        /* Reallocate if the number of used entries is much smaller. */
        if ( count < num_glyphs / 2 )
        {
          (void)FT_RENEW_ARRAY( table->maps, num_glyphs, count );
          error = FT_Err_Ok;
        }

        /* Sort the table in increasing order of unicode values, */
        /* taking care of glyph variants.                        */
        ft_qsort( table->maps, count, sizeof ( PS_UniMap ),
                  compare_uni_maps );
      }

      table->num_maps = count;
    }

    return error;
  }